

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

type * __thiscall
toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::cast<(toml::value_t)9>
          (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *this)

{
  array_type *paVar1;
  allocator<char> local_31;
  string local_30;
  
  if (this->type_ == array) {
    paVar1 = as_array(this);
    return paVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"toml::value::cast: ",&local_31);
  detail::
  throw_bad_cast<(toml::value_t)9,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
            (&local_30,this->type_,this);
}

Assistant:

typename detail::enum_to_type<T, value_type>::type const& cast() const&
    {
        if(this->type_ != T)
        {
            detail::throw_bad_cast<T>("toml::value::cast: ", this->type_, *this);
        }
        return detail::switch_cast<T>::invoke(*this);
    }